

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int properties_set_correlation_id(PROPERTIES_HANDLE properties,AMQP_VALUE correlation_id_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar2 = 0x4069;
  }
  else {
    if (correlation_id_value == (AMQP_VALUE)0x0) {
      item_value = (AMQP_VALUE)0x0;
    }
    else {
      item_value = amqpvalue_clone(correlation_id_value);
    }
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x4079;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,5,item_value);
      iVar2 = 0x407f;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int properties_set_correlation_id(PROPERTIES_HANDLE properties, AMQP_VALUE correlation_id_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE correlation_id_amqp_value;
        if (correlation_id_value == NULL)
        {
            correlation_id_amqp_value = NULL;
        }
        else
        {
            correlation_id_amqp_value = amqpvalue_clone(correlation_id_value);
        }
        if (correlation_id_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 5, correlation_id_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(correlation_id_amqp_value);
        }
    }

    return result;
}